

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O3

int DataManager::getLinkId(int index,char *id,Network *nw)

{
  int iVar1;
  undefined4 extraout_var;
  char *__to;
  
  if ((-1 < index) && (iVar1 = Network::count(nw,LINK), index < iVar1)) {
    iVar1 = Network::link(nw,(char *)(ulong)(uint)index,__to);
    strcpy(id,*(char **)(CONCAT44(extraout_var,iVar1) + 8));
    return 0;
  }
  *id = '\0';
  return 0xcd;
}

Assistant:

int DataManager::getLinkId(int index, char* id, Network* nw)
{
    if ( index < 0 || index >= nw->count(Element::LINK) )
    {
        strcpy(id, "");
        return 205;
    }
    strcpy(id, nw->link(index)->name.c_str());
    return 0;
}